

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_implementation.hpp
# Opt level: O3

event_queue_t * __thiscall
so_5::disp::thread_pool::common_implementation::
dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
::bind_agent_with_inidividual_fifo
          (dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
           *this,agent_ref_t *agent,bind_params_t *params)

{
  _func_int **pp_Var1;
  atomic_refcounted_t *paVar2;
  event_queue_t *peVar3;
  agent_t *agent_ptr;
  agent_queue_ref_t queue;
  agent_queue_ref_t local_40;
  undefined1 local_38 [16];
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t> local_28;
  agent_t *local_20;
  
  make_new_agent_queue
            ((dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
              *)local_38,(bind_params_t *)this);
  local_20 = agent->m_obj;
  local_40.m_obj = (agent_queue_t *)local_38._0_8_;
  agent_ptr = local_20;
  if ((event_queue_t *)local_38._0_8_ != (event_queue_t *)0x0) {
    LOCK();
    ((event_queue_t *)(local_38._0_8_ + 8))->_vptr_event_queue_t =
         (_func_int **)((long)((event_queue_t *)(local_38._0_8_ + 8))->_vptr_event_queue_t + 1);
    UNLOCK();
    agent_ptr = agent->m_obj;
  }
  agent_data_t::agent_data_t
            ((agent_data_t *)(local_38 + 8),&local_40,&(this->m_data_source).m_prefix,agent_ptr);
  std::
  _Rb_tree<so_5::agent_t*,std::pair<so_5::agent_t*const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::agent_data_t>,std::_Select1st<std::pair<so_5::agent_t*const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::agent_data_t>>,std::less<so_5::agent_t*>,std::allocator<std::pair<so_5::agent_t*const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::agent_data_t>>>
  ::
  _M_emplace_unique<so_5::agent_t*,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::agent_data_t>
            ((_Rb_tree<so_5::agent_t*,std::pair<so_5::agent_t*const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::agent_data_t>,std::_Select1st<std::pair<so_5::agent_t*const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::agent_data_t>>,std::less<so_5::agent_t*>,std::allocator<std::pair<so_5::agent_t*const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::agent_data_t>>>
              *)&this->m_agents,&local_20,(agent_data_t *)(local_38 + 8));
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::dismiss_object
            (&local_28);
  if ((_func_int **)local_38._8_8_ != (_func_int **)0x0) {
    LOCK();
    pp_Var1 = (_func_int **)(local_38._8_8_ + 8);
    *pp_Var1 = *pp_Var1 + -1;
    UNLOCK();
    if ((*pp_Var1 == (_func_int *)0x0) && ((_func_int **)local_38._8_8_ != (_func_int **)0x0)) {
      (**(code **)(*(_func_int **)local_38._8_8_ + 8))();
    }
    local_38._8_8_ = (_func_int **)0x0;
  }
  if (local_40.m_obj != (agent_queue_t *)0x0) {
    LOCK();
    paVar2 = &(local_40.m_obj)->super_atomic_refcounted_t;
    (paVar2->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar2->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar2->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (local_40.m_obj != (agent_queue_t *)0x0)) {
      (*((local_40.m_obj)->super_event_queue_t)._vptr_event_queue_t[1])();
    }
    local_40.m_obj = (agent_queue_t *)0x0;
  }
  if ((_func_int **)local_38._0_8_ != (_func_int **)0x0) {
    LOCK();
    peVar3 = (event_queue_t *)(local_38._0_8_ + 8);
    peVar3->_vptr_event_queue_t = (_func_int **)((long)peVar3->_vptr_event_queue_t + -1);
    UNLOCK();
    if ((peVar3->_vptr_event_queue_t == (_func_int **)0x0) &&
       ((_func_int **)local_38._0_8_ != (_func_int **)0x0)) {
      (*(*(_func_int ***)local_38._0_8_)[1])();
    }
  }
  return (event_queue_t *)(_func_int **)local_38._0_8_;
}

Assistant:

event_queue_t *
		bind_agent_with_inidividual_fifo(
			agent_ref_t agent,
			const PARAMS & params )
			{
				auto queue = make_new_agent_queue( params );

				m_agents.emplace(
						agent.get(),
						agent_data_t{
								queue,
								m_data_source.prefix(),
								agent.get() } );

				return queue.get();
			}